

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

int ABC_AddTarget(ABC_Manager mng,int nog,char **names,int *values)

{
  int iVar1;
  int local_3c;
  char *pcStack_38;
  int i;
  Abc_Obj_t *pObj;
  int *values_local;
  char **names_local;
  ABC_Manager pAStack_18;
  int nog_local;
  ABC_Manager mng_local;
  
  pObj = (Abc_Obj_t *)values;
  values_local = (int *)names;
  names_local._4_4_ = nog;
  pAStack_18 = mng;
  if (nog < 1) {
    printf("ABC_AddTarget: The target has no gates.\n");
    mng_local._4_4_ = 0;
  }
  else {
    mng->nog = 0;
    Vec_PtrClear(mng->vNodes);
    Vec_IntClear(pAStack_18->vValues);
    for (local_3c = 0; local_3c < names_local._4_4_; local_3c = local_3c + 1) {
      iVar1 = stmm_lookup(pAStack_18->tName2Node,*(char **)(values_local + (long)local_3c * 2),
                          &stack0xffffffffffffffc8);
      if (iVar1 == 0) {
        printf("ABC_AddTarget: The target gate \"%s\" is not in the network.\n",
               *(undefined8 *)(values_local + (long)local_3c * 2));
        return 0;
      }
      Vec_PtrPush(pAStack_18->vNodes,pcStack_38);
      if ((*(int *)((long)&pObj->pNtk + (long)local_3c * 4) < 0) ||
         (1 < *(int *)((long)&pObj->pNtk + (long)local_3c * 4))) {
        printf("ABC_AddTarget: The value of gate \"%s\" is not 0 or 1.\n",
               *(undefined8 *)(values_local + (long)local_3c * 2));
        return 0;
      }
      Vec_IntPush(pAStack_18->vValues,*(int *)((long)&pObj->pNtk + (long)local_3c * 4));
    }
    pAStack_18->nog = names_local._4_4_;
    mng_local._4_4_ = 1;
  }
  return mng_local._4_4_;
}

Assistant:

int ABC_AddTarget( ABC_Manager mng, int nog, char ** names, int * values )
{
    Abc_Obj_t * pObj;
    int i;
    if ( nog < 1 )
        { printf( "ABC_AddTarget: The target has no gates.\n" ); return 0; }
    // clear storage for the target
    mng->nog = 0;
    Vec_PtrClear( mng->vNodes );
    Vec_IntClear( mng->vValues );
    // save the target
    for ( i = 0; i < nog; i++ )
    {
        if ( !stmm_lookup( mng->tName2Node, names[i], (char **)&pObj ) )
            { printf( "ABC_AddTarget: The target gate \"%s\" is not in the network.\n", names[i] ); return 0; }
        Vec_PtrPush( mng->vNodes, pObj );
        if ( values[i] < 0 || values[i] > 1 )
            { printf( "ABC_AddTarget: The value of gate \"%s\" is not 0 or 1.\n", names[i] ); return 0; }
        Vec_IntPush( mng->vValues, values[i] );
    }
    mng->nog = nog;
    return 1;
}